

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5TransponderBasicData.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::Mode5TransponderBasicData::Mode5TransponderBasicData
          (Mode5TransponderBasicData *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__Mode5TransponderBasicData_00226b88;
  Mode5TransponderStatus::Mode5TransponderStatus(&this->m_Status);
  this->m_ui16PIN = 0;
  this->m_ui32MsgFormats = 0;
  EnhancedMode1Code::EnhancedMode1Code(&this->m_EM1Code);
  this->m_ui16NationalOrigin = 0;
  Mode5TransponderSupplementalData::Mode5TransponderSupplementalData(&this->m_SupplementalData);
  this->m_ui8NavSrc = '\0';
  this->m_ui8FigMerit = '\0';
  this->m_ui8Padding = '\0';
  return;
}

Assistant:

Mode5TransponderBasicData::Mode5TransponderBasicData() :
    m_ui16PIN( 0 ),
    m_ui32MsgFormats( 0 ),
    m_ui16NationalOrigin( 0 ),
    m_ui8NavSrc( 0 ),
    m_ui8FigMerit( 0 ),
    m_ui8Padding( 0 )
{
}